

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O3

void __thiscall wabt::Module::AppendFields(Module *this,ModuleFieldList *fields)

{
  long lVar1;
  long lVar2;
  pointer *__ptr;
  ModuleFieldList *pMVar3;
  __uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_28;
  
  lVar1 = *(long *)(fields + 0x10);
  if (lVar1 != 0) {
    do {
      local_28._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
      super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl =
           *(tuple<wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_> *)fields;
      if (local_28._M_t.
          super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
          super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl ==
          (_Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>)
          *(_Head_base<0UL,_wabt::ModuleField_*,_false> *)(fields + 8)) {
        lVar2 = 0;
        pMVar3 = fields + 8;
      }
      else {
        lVar2 = *(long *)((long)local_28._M_t.
                                super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>
                                .super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl + 8)
        ;
        pMVar3 = (ModuleFieldList *)(lVar2 + 0x10);
      }
      *(undefined8 *)pMVar3 = 0;
      *(long *)fields = lVar2;
      *(long *)((long)local_28._M_t.
                      super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>
                      .super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl + 8) = 0;
      *(long *)((long)local_28._M_t.
                      super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>
                      .super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl + 0x10) = 0;
      *(long *)(fields + 0x10) = lVar1 + -1;
      AppendField(this,(unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)
                       &local_28);
      if ((_Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>)
          local_28._M_t.
          super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
          super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl != (ModuleField *)0x0) {
        (**(code **)(*(long *)local_28._M_t.
                              super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>
                              .super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl + 8))
                  ();
      }
      lVar1 = *(long *)(fields + 0x10);
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

inline bool intrusive_list<T>::empty() const noexcept {
  return size_ == 0;
}